

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

float * ma_dr_wav__read_pcm_frames_and_close_f32
                  (ma_dr_wav *pWav,uint *channels,uint *sampleRate,ma_uint64 *totalFrameCount)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  size_t sVar4;
  float *pBufferOut;
  ma_uint64 mVar5;
  
  sVar4 = (ulong)pWav->channels * pWav->totalPCMFrameCount * 4;
  p_Var1 = (pWav->allocationCallbacks).onMalloc;
  if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
    p_Var2 = (pWav->allocationCallbacks).onRealloc;
    if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_001558f9;
    pBufferOut = (float *)(*p_Var2)((void *)0x0,sVar4,(pWav->allocationCallbacks).pUserData);
  }
  else {
    pBufferOut = (float *)(*p_Var1)(sVar4,(pWav->allocationCallbacks).pUserData);
  }
  if (pBufferOut != (float *)0x0) {
    mVar5 = ma_dr_wav_read_pcm_frames_f32(pWav,pWav->totalPCMFrameCount,pBufferOut);
    if (mVar5 == pWav->totalPCMFrameCount) {
      ma_dr_wav_uninit(pWav);
      if (sampleRate != (uint *)0x0) {
        *sampleRate = pWav->sampleRate;
      }
      if (channels != (uint *)0x0) {
        *channels = (uint)pWav->channels;
      }
      if (totalFrameCount == (ma_uint64 *)0x0) {
        return pBufferOut;
      }
      *totalFrameCount = pWav->totalPCMFrameCount;
      return pBufferOut;
    }
    p_Var3 = (pWav->allocationCallbacks).onFree;
    if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
      (*p_Var3)(pBufferOut,(pWav->allocationCallbacks).pUserData);
    }
  }
LAB_001558f9:
  ma_dr_wav_uninit(pWav);
  return (float *)0x0;
}

Assistant:

MA_PRIVATE float* ma_dr_wav__read_pcm_frames_and_close_f32(ma_dr_wav* pWav, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalFrameCount)
{
    ma_uint64 sampleDataSize;
    float* pSampleData;
    ma_uint64 framesRead;
    MA_DR_WAV_ASSERT(pWav != NULL);
    sampleDataSize = pWav->totalPCMFrameCount * pWav->channels * sizeof(float);
    if (sampleDataSize > MA_SIZE_MAX) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    pSampleData = (float*)ma_dr_wav__malloc_from_callbacks((size_t)sampleDataSize, &pWav->allocationCallbacks);
    if (pSampleData == NULL) {
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    framesRead = ma_dr_wav_read_pcm_frames_f32(pWav, (size_t)pWav->totalPCMFrameCount, pSampleData);
    if (framesRead != pWav->totalPCMFrameCount) {
        ma_dr_wav__free_from_callbacks(pSampleData, &pWav->allocationCallbacks);
        ma_dr_wav_uninit(pWav);
        return NULL;
    }
    ma_dr_wav_uninit(pWav);
    if (sampleRate) {
        *sampleRate = pWav->sampleRate;
    }
    if (channels) {
        *channels = pWav->channels;
    }
    if (totalFrameCount) {
        *totalFrameCount = pWav->totalPCMFrameCount;
    }
    return pSampleData;
}